

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

uint8_t * lj_err_register_mcode(void *base,size_t sz,uint8_t *info)

{
  info[0x10] = '\n';
  info[0x11] = '\0';
  info[0x12] = '\0';
  info[0x13] = '\0';
  info[0x14] = '\0';
  info[0x15] = '\0';
  info[0x16] = '\0';
  info[0x17] = '\0';
  info[0x18] = '\0';
  info[0x19] = '\0';
  info[0x1a] = '\x1b';
  info[0x1b] = '\0';
  info[0x1c] = '\0';
  info[0x1d] = '\0';
  info[0x1e] = '\0';
  info[0x1f] = '\0';
  info[0x2c] = '\0';
  info[0x2d] = '\0';
  info[0x2e] = '\0';
  info[0x2f] = '\0';
  info[0x30] = '\0';
  info[0x31] = '\0';
  info[0x32] = '\0';
  info[0x33] = '\0';
  info[0x34] = '\0';
  info[0x35] = '\0';
  info[0x36] = '\0';
  info[0x37] = '\0';
  info[0x38] = '\0';
  info[0x39] = '\0';
  info[0x3a] = '\0';
  info[0x3b] = '\0';
  info[0x20] = '\x14';
  info[0x21] = '\0';
  info[0x22] = '\0';
  info[0x23] = '\0';
  info[0x24] = '$';
  info[0x25] = '\0';
  info[0x26] = '\0';
  info[0x27] = '\0';
  info[0x28] = '\x14';
  info[0x29] = '\0';
  info[0x2a] = '\0';
  info[0x2b] = '\0';
  info[0x2c] = '\0';
  info[0x2d] = '\0';
  info[0x2e] = '\0';
  info[0x2f] = '\0';
  info[0] = '\x1c';
  info[1] = '\0';
  info[2] = '\0';
  info[3] = '\0';
  info[4] = '\0';
  info[5] = '\0';
  info[6] = '\0';
  info[7] = '\0';
  info[8] = '\x01';
  info[9] = 'z';
  info[10] = 'P';
  info[0xb] = 'R';
  info[0xc] = '\0';
  info[0xd] = '\x01';
  info[0xe] = 'x';
  info[0xf] = '\x10';
  *(code **)(info + 0x12) = err_unwind_jit;
  *(int *)(info + 0x2c) = (((int)base + (int)sz) - (int)info) + -0x3c;
  __register_frame(info);
  return info + 0x3c;
}

Assistant:

uint8_t *lj_err_register_mcode(void *base, size_t sz, uint8_t *info)
{
  void **handler;
  memcpy(info, err_frame_jit_template, sizeof(err_frame_jit_template));
  handler = (void *)err_unwind_jit;
  memcpy(info + ERR_FRAME_JIT_OFS_HANDLER, &handler, sizeof(handler));
  *(uint32_t *)(info + ERR_FRAME_JIT_OFS_CODE_SIZE) =
    (uint32_t)(sz - sizeof(err_frame_jit_template) - (info - (uint8_t *)base));
  __register_frame(info + ERR_FRAME_JIT_OFS_REGISTER);
#ifdef LUA_USE_ASSERT
  {
    struct dwarf_eh_bases ehb;
    lj_assertX(_Unwind_Find_FDE(info + sizeof(err_frame_jit_template)+1, &ehb),
	       "bad JIT unwind table registration");
  }
#endif
  return info + sizeof(err_frame_jit_template);
}